

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

int nva_rsunitsz(nva_regspace *regspace)

{
  nva_regspace *regspace_local;
  
  if (regspace->type == NVA_REGSPACE_DPRAM) {
    regspace_local._4_4_ = 4;
  }
  else if (regspace->type - NVA_REGSPACE_RDI < 2) {
    if ((((regspace->card->chipset).chipset == 0x17) || ((regspace->card->chipset).chipset == 0x18))
       || ((regspace->card->chipset).chipset == 0x1f)) {
      regspace_local._4_4_ = 4;
    }
    else {
      regspace_local._4_4_ = 1;
    }
  }
  else {
    regspace_local._4_4_ = 1;
  }
  return regspace_local._4_4_;
}

Assistant:

int nva_rsunitsz(struct nva_regspace *regspace) {
	switch (regspace->type) {
		case NVA_REGSPACE_DPRAM:
			return 4;
		case NVA_REGSPACE_RDI:
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				return 4;
			}
			return 1;
		default:
			return 1;
	}
}